

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_unsignedByte(void)

{
  char cVar1;
  char cVar2;
  XSValue *pXVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  void *pvVar9;
  char *pcVar10;
  bool bVar11;
  Status myStatus;
  char lex_v_ran_iv_2 [3];
  char lex_v_ran_v_2 [2];
  char lex_v_ran_iv_1 [5];
  Status myStatus_14;
  char lex_v_ran_v_2_canrep [2];
  char lex_v_ran_v_1 [5];
  char lex_v_ran_iv_2_canrep [3];
  char lex_iv_2 [8];
  char data_canrep_2 [4];
  char data_canrep_1 [4];
  char lex_v_ran_v_1_canrep [4];
  char lex_iv_1 [10];
  char lex_v_ran_iv_1_canrep [4];
  char data_rawstr_2 [7];
  char data_rawstr_1 [11];
  char lex_v_ran_v_0 [11];
  StrX local_c0;
  char *local_b0;
  char local_a2 [4];
  char local_9e [2];
  undefined4 local_9c;
  undefined1 local_98;
  Status local_94;
  char local_8e [2];
  undefined4 local_8c;
  undefined1 local_88;
  char local_84 [4];
  char local_80 [12];
  char local_74 [4];
  undefined4 local_70;
  char local_6c [4];
  undefined8 local_68;
  undefined2 local_60;
  char local_5c [4];
  undefined4 local_58;
  undefined3 uStack_54;
  char local_50 [16];
  char local_40 [16];
  
  builtin_strncpy(local_40,"   123   \n",0xb);
  local_88 = 0;
  local_8c = 0x3535322b;
  local_9e[0] = '0';
  local_9e[1] = '\0';
  local_98 = 0;
  local_9c = 0x3635322b;
  local_a2[2] = 0;
  local_a2[0] = '-';
  local_a2[1] = '1';
  builtin_strncpy(local_6c,"255",4);
  local_8e[0] = '0';
  local_8e[1] = '\0';
  builtin_strncpy(local_5c,"256",4);
  local_84[2] = 0;
  local_84[0] = '-';
  local_84[1] = '1';
  local_68 = 0x35342e3433623231;
  local_60 = 0x36;
  builtin_strncpy(local_80,"1234b56",8);
  builtin_strncpy(local_50,"   +123  \n",0xb);
  local_70 = 0x333231;
  uStack_54 = 0x3332;
  local_58 = 0x31303030;
  builtin_strncpy(local_74,"123",4);
  local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (cVar2 == '\0') {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xb9f,local_40,local_c0.fLocalForm,1);
    StrX::~StrX(&local_c0);
    errSeen = 1;
  }
  local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_8c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_8c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (cVar2 == '\0') {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba0,&local_8c,local_c0.fLocalForm,1);
    StrX::~StrX(&local_c0);
    errSeen = 1;
  }
  local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_9e,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_9e,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (cVar2 == '\0') {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba1,local_9e,local_c0.fLocalForm,1);
    StrX::~StrX(&local_c0);
    errSeen = 1;
  }
  local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_9c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_9c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (cVar2 == '\0') {
    if ((int)local_b0 != 6) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba4,&local_9c,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_0011ad5b;
    }
  }
  else {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba4,&local_9c,local_c0.fLocalForm,0);
LAB_0011ad5b:
    StrX::~StrX(&local_c0);
    errSeen = 1;
  }
  local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_a2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_a2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (cVar2 == '\0') {
    if ((int)local_b0 != 6) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba5,local_a2,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_0011ae58;
    }
  }
  else {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba5,local_a2,local_c0.fLocalForm,0);
LAB_0011ae58:
    StrX::~StrX(&local_c0);
    errSeen = 1;
  }
  local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (cVar2 == '\0') {
    if ((int)local_b0 != 6) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba8,&local_68,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_0011af55;
    }
  }
  else {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba8,&local_68,local_c0.fLocalForm,0);
LAB_0011af55:
    StrX::~StrX(&local_c0);
    errSeen = 1;
  }
  local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (cVar2 == '\0') {
    if ((int)local_b0 != 6) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xba9,local_80,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_0011b052;
    }
  }
  else {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xba9,local_80,local_c0.fLocalForm,0);
LAB_0011b052:
    StrX::~StrX(&local_c0);
    errSeen = 1;
  }
  bVar8 = true;
  do {
    local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc6,local_40);
      StrX::~StrX(&local_c0);
      errSeen = 1;
    }
    else {
      pvVar9 = (void *)(ulong)(byte)pXVar3[8];
      if (pXVar3[8] != (XSValue)0x7b) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",pvVar9,0x7b)
        ;
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_8c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_8c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc8,&local_8c);
      StrX::~StrX(&local_c0);
      errSeen = 1;
    }
    else {
      pvVar9 = (void *)(ulong)(byte)pXVar3[8];
      if (pXVar3[8] != (XSValue)0xff) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",pvVar9,0xff)
        ;
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_9e,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_9e,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbc9,local_9e);
      StrX::~StrX(&local_c0);
      errSeen = 1;
    }
    else {
      pvVar9 = (void *)(ulong)(byte)pXVar3[8];
      if (pXVar3[8] != (XSValue)0x0) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedByte XSValue, got %d expected %d\n",pvVar9,0);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_9c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_9c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_b0 != 6) {
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_b0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbca,&local_9c,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_c0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar9 = (void *)0xbca;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbca,&local_9c);
      StrX::~StrX(&local_c0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_a2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_a2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_b0 != 6) {
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_b0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbcb,local_a2,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_c0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar9 = (void *)0xbcb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbcb,local_a2);
      StrX::~StrX(&local_c0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_b0 != 6) {
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_b0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbcd,&local_68,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_c0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar9 = (void *)0xbcd;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbcd,&local_68);
      StrX::~StrX(&local_c0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_b0 != 6) {
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_b0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xbce,local_80,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_c0);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      pvVar9 = (void *)0xbce;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbce,local_80);
      StrX::~StrX(&local_c0);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar9);
    }
    bVar11 = bVar8 != false;
    bVar8 = false;
  } while (bVar11);
  bVar8 = true;
  do {
    local_94 = st_Init;
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c0.fUnicodeForm,dt_unsignedByte,&local_94,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbec,local_50);
      StrX::~StrX(&local_c0);
      errSeen = 1;
    }
    else {
      local_b0 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = (char *)&local_70;
      if (local_b0 != pcVar10) {
        pcVar5 = local_b0;
        if (local_b0 == (char *)0x0) {
LAB_0011b7eb:
          if (*pcVar10 == '\0') goto LAB_0011b835;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011b7eb;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbec,local_50,local_c0.fLocalForm,local_b0,&local_70);
        StrX::~StrX(&local_c0);
        errSeen = 1;
      }
LAB_0011b835:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_94 = st_Init;
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c0.fUnicodeForm,dt_unsignedByte,&local_94,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbed,&local_58);
      StrX::~StrX(&local_c0);
      errSeen = 1;
    }
    else {
      local_b0 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_74;
      if (local_b0 != pcVar10) {
        pcVar5 = local_b0;
        if (local_b0 == (char *)0x0) {
LAB_0011b91f:
          if (*pcVar10 == '\0') goto LAB_0011b969;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011b91f;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbed,&local_58,local_c0.fLocalForm,local_b0,local_74);
        StrX::~StrX(&local_c0);
        errSeen = 1;
      }
LAB_0011b969:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_94 = st_Init;
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_8c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_8c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c0.fUnicodeForm,dt_unsignedByte,&local_94,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbef,&local_8c);
      StrX::~StrX(&local_c0);
      errSeen = 1;
    }
    else {
      local_b0 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_6c;
      if (local_b0 != pcVar10) {
        pcVar5 = local_b0;
        if (local_b0 == (char *)0x0) {
LAB_0011ba53:
          if (*pcVar10 == '\0') goto LAB_0011ba9d;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011ba53;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbef,&local_8c,local_c0.fLocalForm,local_b0,local_6c);
        StrX::~StrX(&local_c0);
        errSeen = 1;
      }
LAB_0011ba9d:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_94 = st_Init;
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_9e,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_9e,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_c0.fUnicodeForm,dt_unsignedByte,&local_94,ver_10,bVar8,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf0,local_9e);
      StrX::~StrX(&local_c0);
      errSeen = 1;
    }
    else {
      local_b0 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_8e;
      if (local_b0 != pcVar10) {
        pcVar5 = local_b0;
        if (local_b0 == (char *)0x0) {
LAB_0011bb87:
          if (*pcVar10 == '\0') goto LAB_0011bbd1;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011bb87;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xbf0,local_9e,local_c0.fLocalForm,local_b0,local_8e);
        StrX::~StrX(&local_c0);
        errSeen = 1;
      }
LAB_0011bbd1:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (lVar6 == 0) {
      if ((int)local_b0 != 6) {
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_b0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xbf2,&local_68,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_c0);
        goto LAB_0011bce3;
      }
    }
    else {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf2,&local_68);
      StrX::~StrX(&local_c0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011bce3:
      errSeen = 1;
    }
    local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
    local_c0.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_c0.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,bVar8,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c0);
    if (lVar6 == 0) {
      if ((int)local_b0 != 6) {
        StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_b0 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xbf3,local_80,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_c0);
        goto LAB_0011bde3;
      }
    }
    else {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xbf3,local_80);
      StrX::~StrX(&local_c0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011bde3:
      errSeen = 1;
    }
    bVar11 = bVar8 != false;
    bVar8 = false;
  } while (bVar11);
  local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_9c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_9c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (lVar6 == 0) {
    if ((int)local_b0 != 6) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xbf8,&local_9c,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
      StrX::~StrX(&local_c0);
      goto LAB_0011bf07;
    }
  }
  else {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbf8,&local_9c);
    StrX::~StrX(&local_c0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011bf07:
    errSeen = 1;
  }
  local_b0 = (char *)((ulong)local_b0 & 0xffffffff00000000);
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_a2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_a2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_c0.fUnicodeForm,dt_unsignedByte,(Status *)&local_b0,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (lVar6 == 0) {
    if ((int)local_b0 != 6) {
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      if (((ulong)local_b0 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_b0 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xbf9,local_a2,local_c0.fLocalForm,"st_FOCA0002",pcVar10);
      StrX::~StrX(&local_c0);
      goto LAB_0011c01b;
    }
  }
  else {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbf9,local_a2);
    StrX::~StrX(&local_c0);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_0011c01b:
    errSeen = 1;
  }
  local_94 = st_Init;
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_9c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_9c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_c0.fUnicodeForm,dt_unsignedByte,&local_94,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbfc,&local_9c);
    StrX::~StrX(&local_c0);
    errSeen = 1;
  }
  else {
    pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = local_5c;
    local_b0 = pcVar5;
    if (pcVar5 != pcVar10) {
      pcVar7 = pcVar5;
      if (pcVar5 == (char *)0x0) {
LAB_0011c100:
        if (*pcVar10 == '\0') goto LAB_0011c14c;
      }
      else {
        do {
          cVar2 = *pcVar7;
          if (cVar2 == '\0') goto LAB_0011c100;
          cVar1 = *pcVar10;
          pcVar10 = pcVar10 + 1;
          pcVar7 = pcVar7 + 1;
        } while (cVar2 == cVar1);
      }
      StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xbfc,&local_9c,local_c0.fLocalForm,pcVar5,local_5c);
      StrX::~StrX(&local_c0);
      errSeen = 1;
    }
LAB_0011c14c:
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
    xercesc_4_0::XMLString::release(&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  local_94 = st_Init;
  local_c0.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_a2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_c0.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_a2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_c0.fUnicodeForm,dt_unsignedByte,&local_94,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c0);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xbfd,local_a2,local_c0.fLocalForm);
    StrX::~StrX(&local_c0);
    errSeen = 1;
    return;
  }
  pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar10 = local_84;
  local_b0 = pcVar5;
  if (pcVar5 != pcVar10) {
    pcVar7 = pcVar5;
    if (pcVar5 == (char *)0x0) {
LAB_0011c245:
      if (*pcVar10 == '\0') goto LAB_0011c291;
    }
    else {
      do {
        cVar2 = *pcVar7;
        if (cVar2 == '\0') goto LAB_0011c245;
        cVar1 = *pcVar10;
        pcVar10 = pcVar10 + 1;
        pcVar7 = pcVar7 + 1;
      } while (cVar2 == cVar1);
    }
    StrX::StrX(&local_c0,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
    printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
           ,0xbfd,local_a2,local_c0.fLocalForm,pcVar5,local_84);
    StrX::~StrX(&local_c0);
    errSeen = 1;
  }
LAB_0011c291:
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
  xercesc_4_0::XMLString::release(&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void test_dt_unsignedByte()
{
    const XSValue::DataType dt = XSValue::dt_unsignedByte;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   123   \n";

    const char lex_v_ran_v_1[]="+255";
    const char lex_v_ran_v_2[]="0";
    const char lex_v_ran_iv_1[]="+256";
    const char lex_v_ran_iv_2[]="-1";

    XSValue::XSValue_Data act_v_ran_v_0;  act_v_ran_v_0.fValue.f_uchar = (unsigned char)123;
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_uchar = (unsigned char)+255;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_uchar = (unsigned char)0;

    const char lex_v_ran_v_1_canrep[]="255";
    const char lex_v_ran_v_2_canrep[]="0";
    const char lex_v_ran_iv_1_canrep[]="256";
    const char lex_v_ran_iv_2_canrep[]="-1";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.24.2 Canonical representation
 *
 * The canonical representation for unsignedByte is defined by prohibiting certain options from the
 * Lexical representation (3.3.24.1). Specifically,
 * 1. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +123  \n";
    const char data_canrep_1[]="123";
    const char data_rawstr_2[]="000123";
    const char data_canrep_2[]="123";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep,  DONT_CARE);

        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}